

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event_loop.hpp
# Opt level: O0

bool __thiscall
cppurses::detail::Timer_event_loop::unregister_widget(Timer_event_loop *this,Widget *w)

{
  size_type sVar1;
  Widget *local_20;
  Widget *local_18;
  Widget *w_local;
  Timer_event_loop *this_local;
  
  local_20 = w;
  local_18 = w;
  w_local = (Widget *)this;
  sVar1 = std::
          set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
          ::erase(&this->registered_widgets_,&local_20);
  return sVar1 == 1;
}

Assistant:

bool unregister_widget(Widget& w)
    {
        return registered_widgets_.erase(&w) == 1;
    }